

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int has_html(SXML_CHAR *html)

{
  char cVar1;
  SXML_CHAR *html_local;
  
  if (html != (SXML_CHAR *)0x0) {
    cVar1 = *html;
    while (cVar1 != '\0') {
      if (*html == '&') {
        return 1;
      }
      cVar1 = html[1];
      html = html + 1;
    }
  }
  return 0;
}

Assistant:

int has_html(SXML_CHAR* html)
{
	if (html == NULL || *html == NULC)
		return FALSE;

	do {
		if (*html++ == C2SX('&'))
			return TRUE;
	} while (*html);
	
	return FALSE;
}